

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

bool __thiscall
QMetaMethod::invokeOnGadget
          (QMetaMethod *this,QObject *gadget,void *param_3,char *param_4,undefined8 param_5,
          char *param_6,undefined8 param_7,QMetaType *param_8,undefined8 param_9,undefined8 param_10
          ,undefined8 param_11,undefined8 param_12,undefined8 param_13,undefined8 param_14,
          undefined8 param_15,undefined8 param_16,undefined8 param_17,undefined8 param_18,
          undefined8 param_19,undefined8 param_20,undefined8 param_21,undefined8 param_22,
          undefined8 param_23,undefined8 param_24)

{
  Data *pDVar1;
  uint *puVar2;
  StaticMetacallFunction p_Var3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  char *str2;
  QMetaType iface;
  storage_type *extraout_RDX;
  char *str1;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView typeName;
  void *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  QByteArray local_98;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = false;
  if ((gadget == (QObject *)0x0) || (this->mobj == (QMetaObject *)0x0)) goto LAB_00282c3e;
  if (param_3 == (void *)0x0) {
LAB_00282a8a:
    local_98.d.ptr = param_6;
    local_98.d.size = (qsizetype)param_8;
    local_80 = param_10;
    local_78 = param_12;
    local_70 = param_14;
    local_68 = param_16;
    local_60 = param_18;
    local_58 = param_20;
    local_50 = param_22;
    local_48 = param_24;
    lVar7 = 1;
    do {
      pDVar1 = (&local_98.d.d)[lVar7];
      if ((pDVar1 == (Data *)0x0) || (*(char *)&(pDVar1->super_QArrayData).ref_._q_value == '\0'))
      goto LAB_00282b67;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xb);
    lVar7 = 0xb;
LAB_00282b67:
    puVar2 = (this->data).d;
    if ((int)puVar2[1] < (int)lVar7) {
      local_e8 = param_7;
      local_e0 = param_9;
      local_d8 = param_11;
      local_d0 = param_13;
      local_c8 = param_15;
      local_c0 = param_17;
      local_b8 = param_19;
      local_b0 = param_21;
      local_a8 = param_23;
      p_Var3 = (this->mobj->d).static_metacall;
      bVar8 = p_Var3 != (StaticMetacallFunction)0x0;
      local_f8 = param_3;
      local_f0 = param_5;
      if (bVar8) {
        puVar4 = (this->mobj->d).data;
        (*p_Var3)(gadget,InvokeMetaMethod,
                  (int)((((long)puVar2 - (long)puVar4 >> 2) - (long)(int)puVar4[5]) / 6),&local_f8);
      }
      goto LAB_00282c3e;
    }
  }
  else {
    str2 = QMetaMethod::typeName(this);
    iVar5 = qstrcmp(param_4,str2);
    if (iVar5 == 0) goto LAB_00282a8a;
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QMetaObject::normalizedType(&local_98,param_4);
    str1 = local_98.d.ptr;
    if (local_98.d.ptr == (char *)0x0) {
      str1 = &QByteArray::_empty;
    }
    iVar5 = qstrcmp(str1,str2);
    if (iVar5 == 0) {
LAB_00282a67:
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_00282a8a;
    }
    iVar5 = returnType(this);
    if (iVar5 != 0) {
      typeName.m_data = extraout_RDX;
      typeName.m_size = (qsizetype)local_98.d.ptr;
      iface = QMetaType::fromName((QMetaType *)local_98.d.size,typeName);
      if (iface.d_ptr != (QMetaTypeInterface *)0x0) {
        iVar6 = ((iface.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar6 == 0) {
          iVar6 = QMetaType::registerHelper(iface.d_ptr);
        }
        if (iVar5 == iVar6) goto LAB_00282a67;
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  bVar8 = false;
LAB_00282c3e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invokeOnGadget(void *gadget,
                                 QGenericReturnArgument returnValue,
                                 QGenericArgument val0,
                                 QGenericArgument val1,
                                 QGenericArgument val2,
                                 QGenericArgument val3,
                                 QGenericArgument val4,
                                 QGenericArgument val5,
                                 QGenericArgument val6,
                                 QGenericArgument val7,
                                 QGenericArgument val8,
                                 QGenericArgument val9) const
{
   if (!gadget || !mobj)
        return false;

    // check return type
    if (returnValue.data()) {
        const char *retType = typeName();
        if (qstrcmp(returnValue.name(), retType) != 0) {
            // normalize the return value as well
            QByteArray normalized = QMetaObject::normalizedType(returnValue.name());
            if (qstrcmp(normalized.constData(), retType) != 0) {
                // String comparison failed, try compare the metatype.
                int t = returnType();
                if (t == QMetaType::UnknownType || t != QMetaType::fromName(normalized).id())
                    return false;
            }
        }
    }

    // check argument count (we don't allow invoking a method if given too few arguments)
    const char *typeNames[] = {
        returnValue.name(),
        val0.name(),
        val1.name(),
        val2.name(),
        val3.name(),
        val4.name(),
        val5.name(),
        val6.name(),
        val7.name(),
        val8.name(),
        val9.name()
    };
    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    if (paramCount <= QMetaMethodPrivate::get(this)->parameterCount())
        return false;

    // invoke!
    void *param[] = {
        returnValue.data(),
        val0.data(),
        val1.data(),
        val2.data(),
        val3.data(),
        val4.data(),
        val5.data(),
        val6.data(),
        val7.data(),
        val8.data(),
        val9.data()
    };
    int idx_relative = QMetaMethodPrivate::get(this)->ownMethodIndex();
    Q_ASSERT(QMetaObjectPrivate::get(mobj)->revision >= 6);
    QObjectPrivate::StaticMetaCallFunction callFunction = mobj->d.static_metacall;
    if (!callFunction)
        return false;
    callFunction(reinterpret_cast<QObject*>(gadget), QMetaObject::InvokeMetaMethod, idx_relative, param);
    return true;
}